

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_elast.c
# Opt level: O2

REF_STATUS ref_elast_free(REF_ELAST ref_elast)

{
  if (ref_elast != (REF_ELAST)0x0) {
    free(ref_elast->bc);
    free(ref_elast->displacement);
    free(ref_elast->a);
    ref_comprow_free(ref_elast->ref_comprow);
    free(ref_elast);
    return 0;
  }
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_elast_free(REF_ELAST ref_elast) {
  if (NULL == (void *)ref_elast) return REF_NULL;

  ref_free(ref_elast->bc);
  ref_free(ref_elast->displacement);
  ref_free(ref_elast->a);
  ref_comprow_free(ref_elast->ref_comprow);

  ref_free(ref_elast);

  return REF_SUCCESS;
}